

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O3

void __thiscall sock_tests::send_and_receive::test_method(send_and_receive *this)

{
  int iVar1;
  Sock *this_00;
  Sock *this_01;
  Sock *this_02;
  Sock *this_03;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  socklen_t len;
  int type;
  int s [2];
  check_type cVar4;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined1 *local_88;
  char **local_80;
  assertion_result local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  SOCKET local_40;
  SOCKET local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CreateSocketPair((int *)&local_40);
  this_00 = (Sock *)operator_new(0x10);
  Sock::Sock(this_00,local_40);
  this_01 = (Sock *)operator_new(0x10);
  Sock::Sock(this_01,local_3c);
  SendAndRecvMessage(this_00,this_01);
  this_02 = (Sock *)operator_new(0x10);
  Sock::Sock(this_02,this_00);
  this_03 = (Sock *)operator_new(0x10);
  Sock::Sock(this_03,0xffffffff);
  (*this_03->_vptr_Sock[2])(this_03,this_01);
  (*this_00->_vptr_Sock[1])(this_00);
  (*this_01->_vptr_Sock[1])(this_01);
  SendAndRecvMessage(this_03,this_02);
  (*this_02->_vptr_Sock[1])(this_02);
  (*this_03->_vptr_Sock[1])(this_03);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x7c;
  file.m_begin = (iterator)&local_50;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  local_a8 = (char *)CONCAT44(local_a8._4_4_,4);
  iVar1 = getsockopt(local_40,1,3,&local_98,(socklen_t *)&local_a8);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == -1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "SocketIsClosed(s[0])";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_b0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_b8,0x7c);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x7d;
  file_00.m_begin = (iterator)&local_c8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d8,msg_00
            );
  local_a8 = (char *)CONCAT44(local_a8._4_4_,4);
  iVar1 = getsockopt(local_3c,1,3,&local_98,(socklen_t *)&local_a8);
  local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == -1);
  local_78.m_message.px = (element_type *)0x0;
  local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = "SocketIsClosed(s[1])";
  local_a0 = "";
  local_98.m_empty = false;
  local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_e0 = "";
  local_80 = &local_a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_78,&local_98,1,0,WARN,_cVar4,(size_t)&local_e8,0x7d);
  boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(send_and_receive)
{
    int s[2];
    CreateSocketPair(s);

    Sock* sock0 = new Sock(s[0]);
    Sock* sock1 = new Sock(s[1]);

    SendAndRecvMessage(*sock0, *sock1);

    Sock* sock0moved = new Sock(std::move(*sock0));
    Sock* sock1moved = new Sock(INVALID_SOCKET);
    *sock1moved = std::move(*sock1);

    delete sock0;
    delete sock1;

    SendAndRecvMessage(*sock1moved, *sock0moved);

    delete sock0moved;
    delete sock1moved;

    BOOST_CHECK(SocketIsClosed(s[0]));
    BOOST_CHECK(SocketIsClosed(s[1]));
}